

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_214010::CAPIBuildSystemFrontendDelegate::shouldResolveCycle
          (CAPIBuildSystemFrontendDelegate *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items,
          Rule *candidateRule,CycleAction action)

{
  uint8_t uVar1;
  CAPIBuildKey *this_00;
  bool bVar2;
  CAPIRulesVector rules;
  BuildKey key;
  
  if ((this->cAPIDelegate).should_resolve_cycle ==
      (_func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
       *)0x0) {
    bVar2 = false;
  }
  else {
    CAPIRulesVector::CAPIRulesVector(&rules,items);
    llbuild::buildsystem::BuildKey::fromData(&key,&candidateRule->key);
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    CAPIBuildKey::CAPIBuildKey(this_00,&key);
    if (SupplyPriorValue < action) {
      __assert_fail("0 && \"unknown cycle action\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                    ,0x213,
                    "static llb_cycle_action_t (anonymous namespace)::CAPIBuildSystemFrontendDelegate::convertCycleAction(core::Rule::CycleAction)"
                   );
    }
    uVar1 = (*(this->cAPIDelegate).should_resolve_cycle)
                      ((this->cAPIDelegate).context,
                       (llb_build_key_t **)
                       rules.rules.
                       super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (long)rules.rules.
                             super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)rules.rules.
                             super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3,
                       (llb_build_key_t *)this_00,action);
    llb_build_key_destroy((llb_build_key_t *)this_00);
    bVar2 = uVar1 != '\0';
    std::__cxx11::string::_M_dispose();
    CAPIRulesVector::~CAPIRulesVector(&rules);
  }
  return bVar2;
}

Assistant:

virtual bool shouldResolveCycle(const std::vector<core::Rule*>& items,
                                  core::Rule* candidateRule,
                                  core::Rule::CycleAction action) override {
    if (!cAPIDelegate.should_resolve_cycle)
      return false;

    CAPIRulesVector rules(items);
    auto key = BuildKey::fromData(candidateRule->key);
    auto candidate = (llb_build_key_t *)new CAPIBuildKey(key);

    uint8_t result = cAPIDelegate.should_resolve_cycle(cAPIDelegate.context,
                                                       rules.data(),
                                                       rules.count(),
                                                       candidate,
                                                       convertCycleAction(action));

    llb_build_key_destroy(candidate);

    return (result);
  }